

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

int Get_TopK<4u>(HashMap<4U> *mp,int k)

{
  int *__first;
  int *piVar1;
  int iVar2;
  ulong uVar3;
  __node_base *p_Var4;
  
  iVar2 = (int)(mp->_M_h)._M_element_count;
  uVar3 = (ulong)iVar2;
  __first = (int *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
  p_Var4 = &(mp->_M_h)._M_before_begin;
  piVar1 = __first;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    *piVar1 = *(int *)((long)(p_Var4 + 1) + 4);
    piVar1 = piVar1 + 1;
  }
  std::nth_element<int*>(__first,__first + uVar3 + -(long)k,__first + uVar3);
  iVar2 = __first[iVar2 - k];
  operator_delete(__first,4);
  return iVar2;
}

Assistant:

int Get_TopK(HashMap<DATA_LEN> mp, int k) {
	int size = mp.size();
	int* num = new int[size];
	int pos = 0;
	typename HashMap<DATA_LEN>::iterator it;
	for (it = mp.begin(); it != mp.end(); ++it) {
		num[pos++] = it->second;
	}
	nth_element(num, num + size - k, num + size);
	int ret = num[size - k];
	delete num;
	return ret;
}